

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

void bam_hdr_destroy(bam_hdr_t *h)

{
  int local_14;
  int32_t i;
  bam_hdr_t *h_local;
  
  if (h != (bam_hdr_t *)0x0) {
    if (h->target_name != (char **)0x0) {
      for (local_14 = 0; local_14 < h->n_targets; local_14 = local_14 + 1) {
        free(h->target_name[local_14]);
      }
      free(h->target_name);
      free(h->target_len);
    }
    free(h->text);
    free(h->cigar_tab);
    if (h->sdict != (void *)0x0) {
      kh_destroy_s2i((kh_s2i_t *)h->sdict);
    }
    free(h);
  }
  return;
}

Assistant:

void bam_hdr_destroy(bam_hdr_t *h)
{
    int32_t i;
    if (h == NULL) return;
    if (h->target_name) {
        for (i = 0; i < h->n_targets; ++i)
            free(h->target_name[i]);
        free(h->target_name);
        free(h->target_len);
    }
    free(h->text); free(h->cigar_tab);
    if (h->sdict) kh_destroy(s2i, (sdict_t*)h->sdict);
    free(h);
}